

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str.c
# Opt level: O1

GCstr * lj_str_new(lua_State *L,char *str,size_t lenx)

{
  uint uVar1;
  bool bVar2;
  GCRef *pGVar3;
  uint *puVar4;
  uint uVar5;
  int iVar6;
  long *plVar7;
  GCstr *pGVar8;
  ulong uVar9;
  uint uVar10;
  byte bVar11;
  uint uVar12;
  ulong extraout_RDX;
  ulong uVar13;
  uint uVar14;
  uint8_t uVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  long lVar21;
  uint *puVar22;
  uint uVar23;
  GCstr *pGVar24;
  uint len;
  bool bVar25;
  GCstr *local_50;
  
  if (0x7ffffeff < lenx) {
    lj_err_msg(L,LJ_ERR_STROV);
  }
  uVar1 = (L->glref).ptr32;
  plVar7 = (long *)(ulong)uVar1;
  len = (uint)lenx;
  if (len == 0) {
    pGVar8 = (GCstr *)(plVar7 + 0x1f);
  }
  else {
    uVar5 = lua_hash(str,len);
    local_50 = (GCstr *)*plVar7;
    pGVar24 = (GCstr *)(ulong)(&local_50->nextgc)[*(uint *)(plVar7 + 1) & uVar5].gcptr32;
    uVar23 = (len + (int)str) - 1 & 0xfff;
    iVar16 = ((uint)(lenx >> 4) & 0xfffffff) + 1;
    uVar14 = 0;
    uVar13 = extraout_RDX;
    if (uVar23 < 0xffd) {
      do {
        pGVar8 = pGVar24;
        if (pGVar8 == (GCstr *)0x0) goto LAB_001185ec;
        if ((pGVar8->hash == uVar5) && (pGVar8->len == len)) {
          uVar14 = uVar14 + iVar16;
          uVar9 = 0;
          do {
            uVar17 = *(uint *)(str + uVar9);
            uVar10 = *(uint *)((long)&pGVar8[1].nextgc.gcptr32 + uVar9);
            if (uVar17 == uVar10) {
              uVar9 = (ulong)((int)uVar9 + 4);
            }
            else {
              uVar18 = (int)uVar9 - len;
              uVar9 = (ulong)uVar18;
              uVar13 = (ulong)((uVar10 ^ uVar17) << ((char)uVar18 * '\b' & 0x1fU));
              if ((int)uVar18 < -3) {
                uVar13 = 1;
              }
            }
            if (uVar17 != uVar10) goto LAB_0011852f;
          } while ((uint)uVar9 < len);
          uVar13 = 0;
LAB_0011852f:
          if ((int)uVar13 != 0) goto LAB_00118533;
          bVar11 = ~*(byte *)(plVar7 + 0xb) & pGVar8->marked;
          uVar13 = CONCAT71((int7)(uVar13 >> 8),bVar11);
          if ((bVar11 & 3) != 0) {
            pGVar8->marked = pGVar8->marked ^ 3;
          }
          plVar7[6] = plVar7[6] + 1;
          bVar25 = false;
          pGVar24 = pGVar8;
        }
        else {
LAB_00118533:
          pGVar3 = &pGVar8->nextgc;
          uVar14 = uVar14 + 1;
          bVar25 = true;
          pGVar8 = local_50;
          pGVar24 = (GCstr *)(ulong)pGVar3->gcptr32;
        }
        local_50 = pGVar8;
      } while (bVar25);
    }
    else {
      do {
        pGVar8 = pGVar24;
        if (pGVar8 == (GCstr *)0x0) goto LAB_001185ec;
        if ((pGVar8->hash == uVar5) && (pGVar8->len == len)) {
          uVar14 = uVar14 + iVar16;
          iVar6 = bcmp(str,pGVar8 + 1,lenx);
          if (iVar6 != 0) goto LAB_001185b0;
          if ((~*(byte *)(plVar7 + 0xb) & pGVar8->marked & 3) != 0) {
            pGVar8->marked = pGVar8->marked ^ 3;
          }
          plVar7[6] = plVar7[6] + 1;
          bVar25 = false;
          pGVar24 = pGVar8;
        }
        else {
LAB_001185b0:
          pGVar3 = &pGVar8->nextgc;
          uVar14 = uVar14 + 1;
          bVar25 = true;
          pGVar8 = local_50;
          pGVar24 = (GCstr *)(ulong)pGVar3->gcptr32;
        }
        local_50 = pGVar8;
      } while (bVar25);
    }
  }
  return pGVar8;
LAB_001185ec:
  if (len < 0xd) {
    uVar15 = '\0';
  }
  else {
    uVar13 = 1L << (byte)(uVar5 >> 0x1a);
    if (((ulong)plVar7[2] >> (uVar5 >> 0x1a) & 1) == 0) {
      bVar25 = false;
    }
    else {
      bVar25 = ((ulong)plVar7[3] >> ((ulong)(uVar5 >> 0x14) & 0x3f) & 1) != 0;
    }
    bVar2 = true;
    uVar17 = 0;
    if ((bVar25) || (0x28 < uVar14)) {
      uVar18 = 0xcafedead;
      uVar10 = 0xdeadbeef;
      uVar19 = 0;
      lVar21 = (ulong)(len - 8) + 8;
      puVar4 = (uint *)str;
      do {
        puVar22 = puVar4;
        lVar20 = lVar21;
        uVar19 = uVar19 ^ *puVar22;
        uVar17 = uVar17 ^ puVar22[1];
        uVar18 = uVar18 + uVar19;
        iVar16 = uVar10 + uVar17;
        uVar17 = (uVar17 << 7 | uVar17 >> 0x19) - uVar18;
        uVar19 = (uVar19 << 5 | uVar19 >> 0x1b) - iVar16;
        uVar18 = (uVar18 * 0x1000000 | uVar18 >> 8) ^ uVar19;
        uVar10 = (iVar16 * 2 | (uint)(iVar16 < 0)) ^ uVar17;
        lVar21 = lVar20 + -8;
        puVar4 = puVar22 + 2;
      } while (8 < (uint)lVar21);
      uVar19 = uVar19 ^ *(uint *)((long)puVar22 + lVar21);
      uVar17 = uVar17 ^ *(uint *)((long)puVar22 + lVar20 + -4);
      uVar12 = (uVar18 + uVar17) - (uVar19 << 9 | uVar19 >> 0x17);
      uVar10 = (uVar10 + uVar19) - (uVar17 << 0x12 | uVar17 >> 0xe);
      uVar18 = (uVar10 ^ uVar12) - (uVar12 * 0x2000000 | uVar12 >> 7);
      uVar19 = ((uVar10 * 0x2000 | uVar10 >> 0x13) +
                (len - ((uVar17 ^ uVar19) << 7 | (uVar17 ^ uVar19) >> 0x19)) + uVar12 ^ uVar18) -
               (uVar18 * 0x10000 | uVar18 >> 0x10);
      uVar10 = (uVar12 ^ uVar19) - (uVar19 * 0x10 | uVar19 >> 0x1c);
      uVar17 = uVar10 * 0x4000 | uVar10 >> 0x12;
      uVar10 = (uVar18 ^ uVar10) - uVar17;
      uVar10 = uVar5 & 0xfc000000 | (uVar19 ^ uVar10) - (uVar10 * 0x1000000 | uVar10 >> 8) >> 6;
      if (bVar25) {
        pGVar8 = (GCstr *)(ulong)*(uint *)(*plVar7 + (ulong)(*(uint *)(plVar7 + 1) & uVar10) * 4);
        if (uVar23 < 0xffd) {
          do {
            if (pGVar8 == (GCstr *)0x0) goto LAB_001188b1;
            if ((pGVar8->hash == uVar10) && (pGVar8->len == len)) {
              uVar9 = 0;
              do {
                uVar23 = *(uint *)(str + uVar9);
                uVar18 = *(uint *)((long)&pGVar8[1].nextgc.gcptr32 + uVar9);
                if (uVar23 == uVar18) {
                  uVar9 = (ulong)((int)uVar9 + 4);
                }
                else {
                  uVar19 = (int)uVar9 - len;
                  uVar9 = (ulong)uVar19;
                  uVar17 = (uVar18 ^ uVar23) << ((char)uVar19 * '\b' & 0x1fU);
                  if ((int)uVar19 < -3) {
                    uVar17 = 1;
                  }
                }
                if (uVar23 != uVar18) goto LAB_00118810;
              } while ((uint)uVar9 < len);
              uVar17 = 0;
LAB_00118810:
              if (uVar17 != 0) goto LAB_00118814;
              bVar11 = ~*(byte *)(plVar7 + 0xb) & pGVar8->marked;
              uVar17 = CONCAT31((int3)(uVar1 >> 8),bVar11);
              if ((bVar11 & 3) != 0) {
                pGVar8->marked = pGVar8->marked ^ 3;
              }
              plVar7[6] = plVar7[6] + 1;
              bVar25 = false;
              local_50 = pGVar8;
            }
            else {
LAB_00118814:
              pGVar8 = (GCstr *)(ulong)(pGVar8->nextgc).gcptr32;
              bVar25 = true;
            }
          } while (bVar25);
        }
        else {
          do {
            if (pGVar8 == (GCstr *)0x0) goto LAB_001188b1;
            if (((pGVar8->hash == uVar10) && (pGVar8->len == len)) &&
               (iVar16 = bcmp(str,pGVar8 + 1,lenx), iVar16 == 0)) {
              if ((~*(byte *)(plVar7 + 0xb) & pGVar8->marked & 3) != 0) {
                pGVar8->marked = pGVar8->marked ^ 3;
              }
              plVar7[6] = plVar7[6] + 1;
              bVar25 = false;
              local_50 = pGVar8;
            }
            else {
              pGVar8 = (GCstr *)(ulong)(pGVar8->nextgc).gcptr32;
              bVar25 = true;
            }
          } while (bVar25);
        }
        bVar2 = false;
        uVar17 = 0;
      }
      else {
LAB_001188b1:
        if (uVar14 < 0x29) {
          uVar17 = 0;
        }
        else {
          plVar7[2] = plVar7[2] | uVar13;
          bVar11 = (byte)(uVar5 >> 0x14);
          uVar9 = 1L << (bVar11 & 0x3f);
          plVar7[3] = plVar7[3] | uVar9;
          uVar17 = (uint)(bVar11 | 0xc0);
          plVar7[4] = plVar7[4] | uVar13;
          plVar7[5] = plVar7[5] | uVar9;
          uVar5 = uVar10;
        }
        bVar2 = true;
      }
    }
    uVar15 = (uint8_t)uVar17;
    if (!bVar2) {
      return local_50;
    }
  }
  plVar7[7] = plVar7[7] + 1;
  pGVar8 = (GCstr *)lj_mem_realloc(L,(void *)0x0,0,len + 0x11);
  pGVar8->marked = *(byte *)(plVar7 + 0xb) & 3;
  pGVar8->gct = '\x04';
  pGVar8->reserved = '\0';
  pGVar8->len = len;
  pGVar8->hash = uVar5;
  pGVar8->strflags = uVar15;
  memcpy(pGVar8 + 1,str,lenx);
  *(undefined1 *)((long)&pGVar8[1].nextgc.gcptr32 + lenx) = 0;
  uVar1 = *(uint *)(plVar7 + 1);
  lVar21 = *plVar7;
  (pGVar8->nextgc).gcptr32 = *(uint32_t *)(lVar21 + (ulong)(uVar5 & uVar1) * 4);
  *(int *)(lVar21 + (ulong)(uVar5 & uVar1) * 4) = (int)pGVar8;
  uVar1 = *(uint *)((long)plVar7 + 0xc);
  *(uint *)((long)plVar7 + 0xc) = uVar1 + 1;
  if (uVar1 <= *(uint *)(plVar7 + 1)) {
    return pGVar8;
  }
  lj_str_resize(L,*(uint *)(plVar7 + 1) * 2 + 1);
  return pGVar8;
}

Assistant:

GCstr *lj_str_new(lua_State *L, const char *str, size_t lenx)
{
  global_State *g;
  GCstr *s;
  GCobj *o;
  MSize len = (MSize)lenx;
  uint8_t strflags = 0;
#if LUAJIT_SMART_STRINGS
  unsigned collisions = 0;
#endif
  if (lenx >= LJ_MAX_STR)
    lj_err_msg(L, LJ_ERR_STROV);
  g = G(L);
  if (len == 0)
    return &g->strempty;
  /* Compute string hash. Constants taken from lookup3 hash by Bob Jenkins. */
  MSize h = lua_hash(str, len);
  /* Check if the string has already been interned. */
  o = gcref(g->strhash[h & g->strmask]);
#if LUAJIT_SMART_STRINGS
/*
** The default "fast" string hash function samples only a few positions
** in a string, the remaining bytes don't affect the function's result.
** The function performs well for short strings; however long strings
** can yield extremely high collision rates.
**
** An adaptive schema was implemented. Two hash functions are used
** simultaneously. A bucket is picked based on the output of the fast
** hash function. If an item is to be inserted in a collision chain
** longer than a certain threshold, another bucket is picked based on
** the stronger hash function. Since two hash functions are used
** simultaneously, insert should consider two buckets. The second bucket
** is often NOT considered thanks to the bloom filter. The filter is
** rebuilt during GC cycle.
**
** Parameters below were tuned on a set of benchmarks. Max_collisions is
** also backed by theory: the expected maximum length of a collision
** chain in a hash table with the fill factor of 1.0 is
** O(log(N)/log(log(N))), assuming uniformly distributed random keys.
** The upper bound for N=65,000 is 10, hence 40 is a clear indication of
** an anomaly.
**/
#define max_collisions 40
#define inc_collision_soft() (collisions++)
/* If different strings yield the same hash sum, grow counter faster. */
#define inc_collision_hard() (collisions+=1+(len>>4), 1)
#else
#define inc_collision_hard() (1)
#define inc_collision_soft()
#endif
  if (LJ_LIKELY((((uintptr_t)str+len-1) & (LJ_PAGESIZE-1)) <= LJ_PAGESIZE-4)) {
    while (o != NULL) {
      GCstr *sx = gco2str(o);
      if (sx->hash == h && sx->len == len && inc_collision_hard() &&
                      str_fastcmp(str, strdata(sx), len) == 0) {
	/* Resurrect if dead. Can only happen with fixstring() (keywords). */
	if (isdead(g, o)) flipwhite(o);
	g->strhash_hit++;
	return sx;  /* Return existing string. */
      }
      o = gcnext(o);
      inc_collision_soft();
    }
  } else {  /* Slow path: end of string is too close to a page boundary. */
    while (o != NULL) {
      GCstr *sx = gco2str(o);
      if (sx->hash == h && sx->len == len && inc_collision_hard() &&
                      memcmp(str, strdata(sx), len) == 0) {
	/* Resurrect if dead. Can only happen with fixstring() (keywords). */
	if (isdead(g, o)) flipwhite(o);
	g->strhash_hit++;
	return sx;  /* Return existing string. */
      }
      o = gcnext(o);
      inc_collision_soft();
    }
  }
#if LUAJIT_SMART_STRINGS
  /* "Fast" hash function consumes all bytes of a string <= 12 bytes. */
  if (len > 12) {
    /*
    ** The bloom filter is keyed with the high 12 bits of the fast
    ** hash sum. The filter is rebuilt during GC cycle. It's beneficial
    ** to have these bits readily available and avoid hash sum
    ** recalculation during GC. High 6 bits are included in the "full"
    ** hash sum, and bits 19-25 are stored in s->strflags.
    **/
    int search_fullh =
       bloomtest(g->strbloom.cur[0], h>>(sizeof(h)*8- 6)) != 0 &&
       bloomtest(g->strbloom.cur[1], h>>(sizeof(h)*8-12)) != 0;
    if (LJ_UNLIKELY(search_fullh || collisions > max_collisions)) {
      MSize fh = lj_fullhash((const uint8_t*)str, len);
#define high6mask ((~(MSize)0)<<(sizeof(MSize)*8-6))
      fh = (fh >> 6) | (h & high6mask);
      if (search_fullh) {
	/* Recheck if the string has already been interned with "harder" hash. */
	o = gcref(g->strhash[fh & g->strmask]);
	if (LJ_LIKELY((((uintptr_t)str+len-1) & (LJ_PAGESIZE-1)) <= LJ_PAGESIZE-4)) {
	  while (o != NULL) {
	    GCstr *sx = gco2str(o);
	    if (sx->hash == fh && sx->len == len && str_fastcmp(str, strdata(sx), len) == 0) {
	      /* Resurrect if dead. Can only happen with fixstring() (keywords). */
	      if (isdead(g, o)) flipwhite(o);
	      g->strhash_hit++;
	      return sx;  /* Return existing string. */
	    }
	    o = gcnext(o);
	  }
	} else {  /* Slow path: end of string is too close to a page boundary. */
	  while (o != NULL) {
	    GCstr *sx = gco2str(o);
	    if (sx->hash == fh && sx->len == len && memcmp(str, strdata(sx), len) == 0) {
	      /* Resurrect if dead. Can only happen with fixstring() (keywords). */
	      if (isdead(g, o)) flipwhite(o);
	      g->strhash_hit++;
	      return sx;  /* Return existing string. */
	    }
	    o = gcnext(o);
	  }
	}
      }
      if (collisions > max_collisions) {
	strflags = 0xc0 | ((h>>(sizeof(h)*8-12))&0x3f);
	bloomset(g->strbloom.cur[0], h>>(sizeof(h)*8- 6));
	bloomset(g->strbloom.cur[1], h>>(sizeof(h)*8-12));
	bloomset(g->strbloom.next[0], h>>(sizeof(h)*8- 6));
	bloomset(g->strbloom.next[1], h>>(sizeof(h)*8-12));
	h = fh;
      }
    }
  }
#endif
  g->strhash_miss++;
  /* Nope, create a new string. */
  s = lj_mem_newt(L, sizeof(GCstr)+len+1, GCstr);
  newwhite(g, s);
  s->gct = ~LJ_TSTR;
  s->len = len;
  s->hash = h;
  s->reserved = 0;
  s->strflags = strflags;
  memcpy(strdatawr(s), str, len);
  strdatawr(s)[len] = '\0';  /* Zero-terminate string. */
  /* Add it to string hash table. */
  h &= g->strmask;
  s->nextgc = g->strhash[h];
  /* NOBARRIER: The string table is a GC root. */
  setgcref(g->strhash[h], obj2gco(s));
  if (g->strnum++ > g->strmask)  /* Allow a 100% load factor. */
    lj_str_resize(L, (g->strmask<<1)+1);  /* Grow string table. */
  return s;  /* Return newly interned string. */
}